

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

bool __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::load
          (section_impl<ELFIO::Elf32_Shdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  element_type *peVar1;
  char *pcVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  int iVar4;
  uint uVar5;
  const_iterator __begin2;
  pointer paVar6;
  undefined4 extraout_var;
  __mbstate_t _Var7;
  long lVar8;
  long lVar9;
  pointer *__ptr;
  undefined8 uVar10;
  bool bVar11;
  unique_ptr<char[],_std::default_delete<char[]>_> decompressed_data;
  Elf_Xword uncompressed_size;
  _Head_base<0UL,_char_*,_false> local_38;
  undefined8 local_30;
  
  _Var7 = header_offset._M_state;
  lVar9 = header_offset._M_off;
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  uVar10 = 0xffffffffffffffff;
  if ((this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::istream::seekg((long)stream,_S_beg);
    uVar10 = std::istream::tellg();
  }
  (*(this->super_section)._vptr_section[0x21])(this,uVar10);
  paVar6 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar6 == (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0010efad:
      std::istream::seekg(stream,lVar9,_Var7);
      std::istream::read((char *)stream,(long)&this->header);
      bVar11 = true;
      if ((this->is_lazy == false) && (this->is_loaded == false)) {
        iVar4 = (*(this->super_section)._vptr_section[0x18])(this);
        bVar11 = CONCAT44(extraout_var,iVar4) != 0;
        uVar5 = (*(this->super_section)._vptr_section[7])(this);
        if (((uVar5 >> 0x1b & 1) == 0) &&
           (uVar5 = (*(this->super_section)._vptr_section[7])(this), (uVar5 >> 0xb & 1) == 0)) {
          return bVar11;
        }
        if ((this->compression).
            super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          iVar4 = (*(this->super_section)._vptr_section[0x13])(this);
          local_30 = 0;
          peVar1 = (this->compression).
                   super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)peVar1 + 0x10))
                    (&local_38,peVar1,
                     (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                     _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,this->convertor,iVar4);
          if (local_38._M_head_impl != (char *)0x0) {
            (*(this->super_section)._vptr_section[0x14])(this,&local_30);
            _Var3._M_head_impl = local_38._M_head_impl;
            local_38._M_head_impl = (char *)0x0;
            pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                     _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
            (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = _Var3._M_head_impl;
            if (pcVar2 != (char *)0x0) {
              operator_delete__(pcVar2);
            }
          }
          if (local_38._M_head_impl != (char *)0x0) {
            operator_delete__(local_38._M_head_impl);
          }
        }
      }
      return bVar11;
    }
    lVar8 = lVar9 - *(long *)paVar6;
    if ((*(long *)paVar6 <= lVar9) && (lVar8 < *(long *)(paVar6 + 0x10))) {
      lVar9 = lVar8 + *(long *)(paVar6 + 0x20);
      _Var7.__count = 0;
      _Var7.__value = (anon_union_4_2_91654ee9_for___value)0x0;
      goto LAB_0010efad;
    }
    paVar6 = paVar6 + 0x30;
  } while( true );
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &header ), sizeof( header ) );

        if ( !( is_lazy || is_loaded ) ) {
            bool ret = get_data();

            if ( is_compressed() ) {
                Elf_Xword size              = get_size();
                Elf_Xword uncompressed_size = 0;
                auto      decompressed_data = compression->inflate(
                    data.get(), convertor, size, uncompressed_size );
                if ( decompressed_data != nullptr ) {
                    set_size( uncompressed_size );
                    data = std::move( decompressed_data );
                }
            }

            return ret;
        }

        return true;
    }